

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

void __thiscall front::syntax::SyntaxAnalyze::gm_const_def(SyntaxAnalyze *this)

{
  undefined1 uVar1;
  bool bVar2;
  irGenerator *this_00;
  size_type sVar3;
  element_type *peVar4;
  element_type *peVar5;
  string *name_00;
  long in_RDI;
  shared_ptr<front::express::ExpressNode> value;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  *__range2_2;
  shared_ptr<front::express::ExpressNode> var;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  *__range2_1;
  shared_ptr<front::express::ExpressNode> i;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  *__range2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inits;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  dimensions;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  init_values;
  SharedExNdPtr dimension;
  SharedSyPtr symbol;
  SymbolKind kind;
  string name;
  SyntaxAnalyze *in_stack_fffffffffffffcd8;
  ArraySymbol *in_stack_fffffffffffffce0;
  Token in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  SyntaxAnalyze *in_stack_fffffffffffffcf0;
  undefined8 in_stack_fffffffffffffd18;
  int value_00;
  undefined8 in_stack_fffffffffffffd20;
  element_type *in_stack_fffffffffffffd28;
  IntSymbol *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  undefined4 in_stack_fffffffffffffd6c;
  uint32_t braceLayerNum;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  *in_stack_fffffffffffffd70;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  SyntaxAnalyze *this_01;
  undefined7 in_stack_fffffffffffffd88;
  shared_ptr<front::symbol::Symbol> local_260;
  int in_stack_fffffffffffffdbc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffdc0;
  string *in_stack_fffffffffffffdc8;
  irGenerator *in_stack_fffffffffffffdd0;
  __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
  local_1e0;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  *local_1d8;
  undefined4 in_stack_fffffffffffffe4c;
  undefined8 in_stack_fffffffffffffe50;
  __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
  local_198;
  undefined1 *local_190;
  undefined1 local_181;
  string local_170 [32];
  string local_150 [39];
  undefined1 local_129;
  string local_128 [36];
  int local_104;
  shared_ptr<front::express::ExpressNode> *local_f0;
  __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
  local_e8;
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  *local_e0;
  undefined1 local_d8 [88];
  undefined1 local_80 [24];
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  local_68 [2];
  int local_2c;
  string local_28 [40];
  
  std::__cxx11::string::string(local_28);
  std::shared_ptr<front::symbol::Symbol>::shared_ptr((shared_ptr<front::symbol::Symbol> *)0x2a25b9);
  std::shared_ptr<front::express::ExpressNode>::shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2a25c6);
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::vector((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
            *)0x2a25d3);
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::vector((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
            *)0x2a25e0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2a25ed);
  match_one_word((SyntaxAnalyze *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
  this_00 = (irGenerator *)get_least_matched_word((SyntaxAnalyze *)0x2a260b);
  word::Word::get_self_abi_cxx11_((Word *)in_stack_fffffffffffffcd8);
  this_01 = (SyntaxAnalyze *)(local_d8 + 0x10);
  std::__cxx11::string::operator=(local_28,(string *)this_01);
  std::__cxx11::string::~string((string *)this_01);
  uVar1 = try_word(in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,in_stack_fffffffffffffce8);
  if ((bool)uVar1) {
    local_2c = 2;
    while (in_stack_fffffffffffffd7f =
                try_word(in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,
                         in_stack_fffffffffffffce8), (bool)in_stack_fffffffffffffd7f) {
      match_one_word((SyntaxAnalyze *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
      gm_const_exp(in_stack_fffffffffffffcd8);
      in_stack_fffffffffffffd70 =
           (vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
            *)local_d8;
      std::shared_ptr<front::express::ExpressNode>::operator=
                ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffce0,
                 (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffcd8);
      std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2a2716);
      match_one_word((SyntaxAnalyze *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
      std::
      vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
      ::push_back((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                   *)in_stack_fffffffffffffcf0,
                  (value_type *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    }
  }
  else {
    local_2c = 0;
  }
  match_one_word((SyntaxAnalyze *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
  bVar2 = try_word(in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,in_stack_fffffffffffffce8);
  braceLayerNum = CONCAT13(bVar2,(int3)in_stack_fffffffffffffd6c);
  if (bVar2) {
    match_one_word((SyntaxAnalyze *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
    gm_const_init_val(this_01,(vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                               *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                      in_stack_fffffffffffffd70,braceLayerNum);
    match_one_word((SyntaxAnalyze *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
  }
  else {
    gm_const_init_val(this_01,(vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                               *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                      in_stack_fffffffffffffd70,braceLayerNum);
  }
  sVar3 = std::
          vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
          ::size(local_68);
  value_00 = (int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
  if (sVar3 != 0) {
    local_e0 = local_68;
    local_e8._M_current =
         (shared_ptr<front::express::ExpressNode> *)
         std::
         vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
         ::begin((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                  *)in_stack_fffffffffffffcd8);
    local_f0 = (shared_ptr<front::express::ExpressNode> *)
               std::
               vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
               ::end((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                      *)in_stack_fffffffffffffcd8);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
                          *)in_stack_fffffffffffffce0,
                         (__normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
                          *)in_stack_fffffffffffffcd8);
      value_00 = (int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
      ::operator*(&local_e8);
      std::shared_ptr<front::express::ExpressNode>::shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffce0,
                 (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffcd8);
      peVar4 = std::
               __shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2a28bc);
      local_104 = peVar4->_value;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffce0,
                 &in_stack_fffffffffffffcd8->_initLayerNum);
      std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2a28ea);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
      ::operator++(&local_e8);
    }
  }
  if (local_2c == 0) {
    operator_new(0x40);
    local_129 = 1;
    std::__cxx11::string::string(local_128,local_28);
    std::
    vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
    ::front((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
             *)in_stack_fffffffffffffce0);
    std::__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x2a2989);
    front::symbol::IntSymbol::IntSymbol
              (in_stack_fffffffffffffd30,(string *)in_stack_fffffffffffffd28,
               (int)((ulong)in_stack_fffffffffffffd20 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffd20 >> 0x18,0),value_00);
    local_129 = 0;
    std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::
    reset<front::symbol::IntSymbol>
              ((__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *)
               in_stack_fffffffffffffcf0,
               (IntSymbol *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::string(local_150,local_28);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::front
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffce0);
    peVar5 = std::
             __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2a2a21);
    front::symbol::Symbol::getId(peVar5);
    irGenerator::irGenerator::ir_declare_const
              (this_00,(string *)CONCAT17(uVar1,in_stack_fffffffffffffd88),
               (uint32_t)((ulong)this_01 >> 0x20),(int)this_01);
    std::__cxx11::string::~string(local_150);
  }
  else {
    name_00 = (string *)operator_new(0x78);
    local_181 = 1;
    std::__cxx11::string::string(local_170,local_28);
    front::symbol::IntSymbol::getHolderIntSymbol();
    front::symbol::ArraySymbol::ArraySymbol
              ((ArraySymbol *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),name_00,
               (SharedSyPtr *)in_stack_fffffffffffffd30,
               (int)((ulong)in_stack_fffffffffffffd28 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffffd28 >> 0x18,0),
               SUB81((ulong)in_stack_fffffffffffffd28 >> 0x10,0));
    local_181 = 0;
    std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::
    reset<front::symbol::ArraySymbol>
              ((__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> *)
               in_stack_fffffffffffffcf0,
               (ArraySymbol *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
    std::shared_ptr<front::symbol::Symbol>::~shared_ptr
              ((shared_ptr<front::symbol::Symbol> *)0x2a2b75);
    std::__cxx11::string::~string(local_170);
    local_190 = local_80;
    local_198._M_current =
         (shared_ptr<front::express::ExpressNode> *)
         std::
         vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
         ::begin((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                  *)in_stack_fffffffffffffcd8);
    std::
    vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
    ::end((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
           *)in_stack_fffffffffffffcd8);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
                               *)in_stack_fffffffffffffce0,
                              (__normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
                               *)in_stack_fffffffffffffcd8), bVar2) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
      ::operator*(&local_198);
      std::shared_ptr<front::express::ExpressNode>::shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffce0,
                 (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffcd8);
      std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
                ((shared_ptr<front::symbol::Symbol> *)
                 CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      in_stack_fffffffffffffd28 =
           std::
           __shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2a2c20);
      in_stack_fffffffffffffd30 = (IntSymbol *)&stack0xfffffffffffffe30;
      std::shared_ptr<front::express::ExpressNode>::shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffce0,
                 (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffcd8);
      front::symbol::ArraySymbol::addDimension
                (in_stack_fffffffffffffce0,(SharedExNdPtr *)in_stack_fffffffffffffcd8);
      std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2a2c5a);
      std::shared_ptr<front::symbol::ArraySymbol>::~shared_ptr
                ((shared_ptr<front::symbol::ArraySymbol> *)0x2a2c67);
      std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2a2c74);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
      ::operator++(&local_198);
    }
    local_1d8 = local_68;
    local_1e0._M_current =
         (shared_ptr<front::express::ExpressNode> *)
         std::
         vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
         ::begin((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                  *)in_stack_fffffffffffffcd8);
    std::
    vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
    ::end((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
           *)in_stack_fffffffffffffcd8);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
                               *)in_stack_fffffffffffffce0,
                              (__normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
                               *)in_stack_fffffffffffffcd8), bVar2) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
      ::operator*(&local_1e0);
      std::shared_ptr<front::express::ExpressNode>::shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffce0,
                 (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffcd8);
      std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
                ((shared_ptr<front::symbol::Symbol> *)
                 CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
      std::__shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<front::symbol::ArraySymbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2a2dde);
      std::shared_ptr<front::express::ExpressNode>::shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffce0,
                 (shared_ptr<front::express::ExpressNode> *)in_stack_fffffffffffffcd8);
      front::symbol::ArraySymbol::addValue
                (in_stack_fffffffffffffce0,(SharedExNdPtr *)in_stack_fffffffffffffcd8);
      std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2a2e18);
      std::shared_ptr<front::symbol::ArraySymbol>::~shared_ptr
                ((shared_ptr<front::symbol::ArraySymbol> *)0x2a2e25);
      std::shared_ptr<front::express::ExpressNode>::~shared_ptr
                ((shared_ptr<front::express::ExpressNode> *)0x2a2e32);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<front::express::ExpressNode>_*,_std::vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>_>
      ::operator++(&local_1e0);
    }
    in_stack_fffffffffffffcf0 = (SyntaxAnalyze *)(in_RDI + 0x80);
    std::__cxx11::string::string((string *)&stack0xfffffffffffffdc8,local_28);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd30,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffd28);
    peVar5 = std::
             __shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2a2ed0);
    front::symbol::Symbol::getId(peVar5);
    irGenerator::irGenerator::ir_declare_const
              (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdbc);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffcf0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc8);
  }
  std::shared_ptr<front::symbol::Symbol>::shared_ptr
            (&local_260,(shared_ptr<front::symbol::Symbol> *)(in_RDI + 0x20));
  symbolTable::SymbolTable::push_symbol
            ((SymbolTable *)this_01,
             (SharedSyPtr *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
  std::shared_ptr<front::symbol::Symbol>::~shared_ptr((shared_ptr<front::symbol::Symbol> *)0x2a2faa)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffcf0);
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::~vector((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
             *)in_stack_fffffffffffffcf0);
  std::
  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ::~vector((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
             *)in_stack_fffffffffffffcf0);
  std::shared_ptr<front::express::ExpressNode>::~shared_ptr
            ((shared_ptr<front::express::ExpressNode> *)0x2a2fde);
  std::shared_ptr<front::symbol::Symbol>::~shared_ptr((shared_ptr<front::symbol::Symbol> *)0x2a2feb)
  ;
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void SyntaxAnalyze::gm_const_def() {
  string name;
  SymbolKind kind;
  SharedSyPtr symbol;
  SharedExNdPtr dimension;
  vector<SharedExNdPtr> init_values;
  vector<SharedExNdPtr> dimensions;
  vector<std::uint32_t> inits;

  match_one_word(Token::IDENFR);
  name = get_least_matched_word().get_self();

  if (try_word(1, Token::LBRACK)) {
    kind = SymbolKind::Array;
    while (try_word(1, Token::LBRACK)) {
      match_one_word(Token::LBRACK);
      dimension = gm_const_exp();
      match_one_word(Token::RBRACK);

      dimensions.push_back(dimension);
    }
  } else {
    kind = SymbolKind::INT;
  }

  match_one_word(Token::ASSIGN);

  if (try_word(1, Token::LBRACE)) {
    match_one_word(Token::LBRACE);
    gm_const_init_val(init_values, dimensions, 0);
    match_one_word(Token::RBRACE);
  } else {
    gm_const_init_val(init_values, dimensions, 0);
  }

  if (init_values.size() > 0) {
    for (auto i : init_values) {
      inits.push_back(i->_value);
    }
  }

  if (kind == SymbolKind::INT) {
    symbol.reset(
        new IntSymbol(name, layer_num, true, init_values.front()->_value));
    irGenerator.ir_declare_const(name, inits.front(), symbol->getId());
  } else {
    symbol.reset(new ArraySymbol(name, IntSymbol::getHolderIntSymbol(),
                                 layer_num, true, false));
    for (auto var : dimensions) {
      std::static_pointer_cast<ArraySymbol>(symbol)->addDimension(var);
    }
    for (auto value : init_values) {
      std::static_pointer_cast<ArraySymbol>(symbol)->addValue(value);
    }

    irGenerator.ir_declare_const(name, inits, symbol->getId());
  }

  symbolTable.push_symbol(symbol);
}